

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

char * kj::_::anon_unknown_0::FloatToBuffer(float value,char *buffer)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  bool local_ca;
  bool local_c9;
  Fault local_c0;
  Fault f_1;
  int *local_b0;
  DebugComparison<int_&,_int> local_a8;
  bool local_7d;
  int local_7c;
  float fStack_78;
  bool _kjCondition_1;
  int snprintf_result2;
  float parsed_value;
  Fault local_68;
  Fault f;
  int *local_58;
  DebugComparison<int_&,_int> local_50;
  bool local_25;
  int local_24;
  bool _kjCondition;
  char *pcStack_20;
  int snprintf_result;
  char *buffer_local;
  char *pcStack_10;
  float value_local;
  
  pcStack_20 = buffer;
  buffer_local._4_4_ = value;
  fVar3 = inf();
  fVar1 = buffer_local._4_4_;
  if ((value != fVar3) || (NAN(value) || NAN(fVar3))) {
    fVar3 = inf();
    if ((fVar1 != -fVar3) || (NAN(fVar1) || NAN(-fVar3))) {
      bVar2 = IsNaN((double)buffer_local._4_4_);
      if (bVar2) {
        strcpy(pcStack_20,"nan");
        pcStack_10 = pcStack_20;
      }
      else {
        local_24 = snprintf(pcStack_20,0x18,"%.*g",(double)buffer_local._4_4_,6);
        local_58 = (int *)DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_24);
        f.exception._4_4_ = 0;
        DebugExpression<int&>::operator>
                  (&local_50,(DebugExpression<int&> *)&local_58,(int *)((long)&f.exception + 4));
        bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)&local_50);
        local_c9 = bVar2 && local_24 < 0x18;
        local_25 = local_c9;
        if (!bVar2 || local_24 >= 0x18) {
          Debug::Fault::Fault<kj::Exception::Type,bool&>
                    (&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                     ,0x1ea,FAILED,"snprintf_result > 0 && snprintf_result < kFloatToBufferSize",
                     "_kjCondition,",&local_25);
          Debug::Fault::fatal(&local_68);
        }
        bVar2 = safe_strtof(pcStack_20,&stack0xffffffffffffff88);
        if (((!bVar2) || (fStack_78 != buffer_local._4_4_)) ||
           (NAN(fStack_78) || NAN(buffer_local._4_4_))) {
          local_7c = snprintf(pcStack_20,0x18,"%.*g",(double)buffer_local._4_4_,8);
          local_b0 = (int *)DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_7c);
          f_1.exception._4_4_ = 0;
          DebugExpression<int&>::operator>
                    (&local_a8,(DebugExpression<int&> *)&local_b0,(int *)((long)&f_1.exception + 4))
          ;
          bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)&local_a8);
          local_ca = bVar2 && local_7c < 0x18;
          local_7d = local_ca;
          if (!bVar2 || local_7c >= 0x18) {
            Debug::Fault::Fault<kj::Exception::Type,bool&>
                      (&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                       ,0x1f2,FAILED,"snprintf_result2 > 0 && snprintf_result2 < kFloatToBufferSize"
                       ,"_kjCondition,",&local_7d);
            Debug::Fault::fatal(&local_c0);
          }
        }
        DelocalizeRadix(pcStack_20);
        RemovePlus(pcStack_20);
        pcStack_10 = pcStack_20;
      }
    }
    else {
      strcpy(pcStack_20,"-inf");
      pcStack_10 = pcStack_20;
    }
  }
  else {
    strcpy(pcStack_20,"inf");
    pcStack_10 = pcStack_20;
  }
  return pcStack_10;
}

Assistant:

char* FloatToBuffer(float value, char* buffer) {
  // FLT_DIG is 6 for IEEE-754 floats, which are used on almost all
  // platforms these days.  Just in case some system exists where FLT_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(FLT_DIG < 10, "FLT_DIG is too big");

  if (value == inf()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -inf()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (IsNaN(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result KJ_UNUSED =
    snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  KJ_DASSERT(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);

  float parsed_value;
  if (!safe_strtof(buffer, &parsed_value) || parsed_value != value) {
    int snprintf_result2 KJ_UNUSED =
      snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG+2, value);

    // Should never overflow; see above.
    KJ_DASSERT(snprintf_result2 > 0 && snprintf_result2 < kFloatToBufferSize);
  }

  DelocalizeRadix(buffer);
  RemovePlus(buffer);
#if _WIN32
  RemoveE0(buffer);
#endif // _WIN32
  return buffer;
}